

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<CLI::App_*const_&,_CLI::App_*const_&> * __thiscall
Catch::ExprLhs<CLI::App*const&>::operator==
          (BinaryExpr<CLI::App_*const_&,_CLI::App_*const_&> *__return_storage_ptr__,
          ExprLhs<CLI::App*const&> *this,App **rhs)

{
  App **lhs;
  bool comparisonResult;
  StringRef local_30;
  App **local_20;
  App **rhs_local;
  ExprLhs<CLI::App_*const_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (App **)this;
  this_local = (ExprLhs<CLI::App_*const_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<CLI::App*,CLI::App*>(*(App ***)this,rhs);
  lhs = *(App ***)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<CLI::App_*const_&,_CLI::App_*const_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }